

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

long __thiscall Samba::go(Samba *this)

{
  SerialPort *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  uint in_ESI;
  uint8_t cmd [11];
  char local_23 [11];
  long lVar3;
  
  if (this->_debug == true) {
    printf("%s(addr=%#x)\n","go",(ulong)in_ESI);
  }
  snprintf(local_23,0xb,"G%08X#",(ulong)in_ESI);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,local_23,10);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (iVar2 == 10) {
    if (this->_isUsb == true) {
      iVar2 = (*((this->_port)._M_t.
                 super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
                 super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
                 super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[10])();
      lVar3 = CONCAT44(extraout_var_00,iVar2);
    }
    return lVar3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001185a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::go(uint32_t addr)
{
    uint8_t cmd[11];

    if (_debug)
        printf("%s(addr=%#x)\n", __FUNCTION__, addr);

    snprintf((char*) cmd, sizeof(cmd), "G%08X#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

    // The SAM firmware can get confused if another command is
    // received in the same USB data packet as the go command
    // so we flush after writing the command over USB.
    if (_isUsb)
        _port->flush();
}